

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mingw_make.cpp
# Opt level: O2

void __thiscall
MingwMakefileGenerator::writeObjectsPart(MingwMakefileGenerator *this,QTextStream *t)

{
  LinkerResponseFileInfo *this_00;
  QMakeProject *pQVar1;
  qsizetype qVar2;
  Data *pDVar3;
  char16_t *pcVar4;
  QString *pQVar5;
  bool bVar6;
  QArrayDataPointer<char16_t> *this_01;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_180;
  ProKey local_168;
  QArrayDataPointer<char16_t> local_138;
  QArrayDataPointer<char16_t> local_118;
  QArrayDataPointer<char16_t> local_f8;
  QStringBuilder<QStringBuilder<QString_&,_char>,_QString> local_d8;
  undefined1 local_b0 [8];
  QArrayDataPointer<char16_t> local_a8 [2];
  undefined1 local_68 [16];
  QArrayDataPointer<char16_t> local_58;
  char (*local_40) [3];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  MakefileGenerator::maybeCreateLinkerResponseFile
            ((LinkerResponseFileInfo *)local_b0,(MakefileGenerator *)this);
  this_00 = &this->linkerResponseFile;
  MakefileGenerator::LinkerResponseFileInfo::operator=(this_00,(LinkerResponseFileInfo *)local_b0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_b0);
  if ((this->linkerResponseFile).filePath.d.size == 0) {
    QString::operator=(&this->objectsLinkLine,"$(OBJECTS)");
    goto LAB_0019d3bf;
  }
  pQVar1 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
  QString::QString((QString *)&local_168,"staticlib");
  bVar6 = QMakeProject::isActiveConfig(pQVar1,(QString *)&local_168,false);
  if (bVar6) {
    pQVar1 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
    ProKey::ProKey((ProKey *)local_68,"TEMPLATE");
    QMakeEvaluator::first((ProString *)local_b0,&pQVar1->super_QMakeEvaluator,(ProKey *)local_68);
    bVar6 = ProString::operator==((ProString *)local_b0,"lib");
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_b0);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_68);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_168);
    if (!bVar6) goto LAB_0019d318;
    local_f8.size = -0x5555555555555556;
    local_f8.d = (Data *)0xaaaaaaaaaaaaaaaa;
    local_f8.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
    ProKey::ProKey((ProKey *)local_b0,"QMAKE_LIB");
    (*(this->super_Win32MakefileGenerator).super_MakefileGenerator.super_QMakeSourceFileInfo.
      _vptr_QMakeSourceFileInfo[0x16])(&local_f8,this,(QArrayDataPointer<char16_t> *)local_b0);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_b0);
    if (local_f8.size == 0) {
      QString::operator=((QString *)&local_f8,"ar -rc");
    }
    ProKey::ProKey(&local_168,"DEST_TARGET");
    (*(this->super_Win32MakefileGenerator).super_MakefileGenerator.super_QMakeSourceFileInfo.
      _vptr_QMakeSourceFileInfo[0x16])(&local_138,this,&local_168);
    local_d8.b.d.size = local_138.size;
    local_d8.b.d.ptr = local_138.ptr;
    local_d8.b.d.d = local_138.d;
    local_d8.a.b = ' ';
    local_138.d = (Data *)0x0;
    local_138.ptr = (char16_t *)0x0;
    local_138.size = 0;
    local_d8.a.a = (QString *)&local_f8;
    QStringBuilder<QStringBuilder<QString_&,_char>,_QString>::QStringBuilder
              ((QStringBuilder<QStringBuilder<QString_&,_char>,_QString> *)local_68,&local_d8);
    local_40 = (char (*) [3])0x21cce0;
    (*(this->super_Win32MakefileGenerator).super_MakefileGenerator.super_QMakeSourceFileInfo.
      _vptr_QMakeSourceFileInfo[0xc])(&local_180,this,this_00);
    QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_char>,_QString>,_const_char_(&)[3]>,_QString>
    ::QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_char>,_QString>,_const_char_(&)[3]>,_QString>
                      *)local_b0,
                     (QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_char>,_QString>,_const_char_(&)[3]>
                      *)local_68,(QString *)&local_180);
    QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_char>,_QString>,_const_char_(&)[3]>,_QString>
    ::convertTo<QString>
              ((QString *)&local_118,
               (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_char>,_QString>,_const_char_(&)[3]>,_QString>
                *)local_b0);
    pDVar3 = (this->objectsLinkLine).d.d;
    pcVar4 = (this->objectsLinkLine).d.ptr;
    (this->objectsLinkLine).d.d = local_118.d;
    (this->objectsLinkLine).d.ptr = local_118.ptr;
    qVar2 = (this->objectsLinkLine).d.size;
    (this->objectsLinkLine).d.size = local_118.size;
    local_118.d = pDVar3;
    local_118.ptr = pcVar4;
    local_118.size = qVar2;
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_118);
    QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_char>,_QString>,_const_char_(&)[3]>,_QString>
    ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_char>,_QString>,_const_char_(&)[3]>,_QString>
                       *)local_b0);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_180);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_d8.b.d);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_138);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_168);
    this_01 = &local_f8;
  }
  else {
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_168);
LAB_0019d318:
    this_01 = (QArrayDataPointer<char16_t> *)&local_168;
    (*(this->super_Win32MakefileGenerator).super_MakefileGenerator.super_QMakeSourceFileInfo.
      _vptr_QMakeSourceFileInfo[0xc])(this_01,this,this_00);
    local_a8[0].size = local_168.super_ProString.m_string.d.size;
    local_a8[0].ptr = local_168.super_ProString.m_string.d.ptr;
    local_a8[0].d = local_168.super_ProString.m_string.d.d;
    local_b0 = (undefined1  [8])0x21b500;
    local_168.super_ProString.m_string.d.d = (Data *)0x0;
    local_168.super_ProString.m_string.d.ptr = (char16_t *)0x0;
    local_168.super_ProString.m_string.d.size = 0;
    QStringBuilder<const_char_(&)[2],_QString>::convertTo<QString>
              ((QString *)local_68,(QStringBuilder<const_char_(&)[2],_QString> *)local_b0);
    pQVar5 = (QString *)(this->objectsLinkLine).d.d;
    pcVar4 = (this->objectsLinkLine).d.ptr;
    (this->objectsLinkLine).d.d = (Data *)local_68._0_8_;
    (this->objectsLinkLine).d.ptr = (char16_t *)local_68._8_8_;
    pDVar3 = (Data *)(this->objectsLinkLine).d.size;
    (this->objectsLinkLine).d.size = (qsizetype)local_58.d;
    local_68._0_8_ = pQVar5;
    local_68._8_8_ = pcVar4;
    local_58.d = pDVar3;
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_68);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(local_a8);
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer(this_01);
LAB_0019d3bf:
  Win32MakefileGenerator::writeObjectsPart(&this->super_Win32MakefileGenerator,t);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void MingwMakefileGenerator::writeObjectsPart(QTextStream &t)
{
    linkerResponseFile = maybeCreateLinkerResponseFile();
    if (!linkerResponseFile.isValid()) {
        objectsLinkLine = "$(OBJECTS)";
    } else if (project->isActiveConfig("staticlib") && project->first("TEMPLATE") == "lib") {
        // QMAKE_LIB is used for win32, including mingw, whereas QMAKE_AR is used on Unix.
        QString ar_cmd = var("QMAKE_LIB");
        if (ar_cmd.isEmpty())
            ar_cmd = "ar -rc";
        objectsLinkLine = ar_cmd + ' ' + var("DEST_TARGET") + " @"
            + escapeFilePath(linkerResponseFile.filePath);
    } else {
        objectsLinkLine = "@" + escapeFilePath(linkerResponseFile.filePath);
    }
    Win32MakefileGenerator::writeObjectsPart(t);
}